

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.cpp
# Opt level: O3

FILE * SJ_fopen(path *fname,char *mode)

{
  size_type sVar1;
  pointer pcVar2;
  FILE *pFVar3;
  long *local_38 [2];
  long local_28 [2];
  
  if ((mode == (char *)0x0) || (sVar1 = (fname->_M_pathname)._M_string_length, sVar1 == 0)) {
    pFVar3 = (FILE *)0x0;
  }
  else {
    pcVar2 = (fname->_M_pathname)._M_dataplus._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar2,pcVar2 + sVar1);
    pFVar3 = fopen((char *)local_38[0],mode);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return (FILE *)pFVar3;
}

Assistant:

FILE* SJ_fopen(const std::filesystem::path & fname, const char* mode) {
	if (nullptr == mode || fname.empty()) return nullptr;
	return fopen(fname.string().c_str(), mode);
}